

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formular_inline.h
# Opt level: O1

float formularAllShipAtk(int *shipAtk)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  float fVar8;
  double dVar9;
  
  if (carrierNum < 1) {
    fVar6 = 0.0;
  }
  else {
    fVar6 = 0.0;
    lVar4 = 0xe;
    lVar3 = 0;
    do {
      if (shipAtk[lVar3] != 0) {
        iVar1 = (int)((double)(shipAtk[lVar3] / 10 +
                              (theCarrier.super__Vector_base<Carrier,_std::allocator<Carrier>_>.
                               _M_impl.super__Vector_impl_data._M_start)->gridSize[lVar4 + -10]) *
                     1.5);
        iVar2 = iVar1 + 0x37;
        if (0x7d < iVar1) {
          dVar7 = (double)(iVar1 + -0x7d);
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          dVar7 = floor(dVar7);
          iVar2 = (int)(dVar7 + 180.0);
        }
        iVar2 = (int)(float)iVar2;
        if (iVar2 < armor_max) {
          fVar8 = 0.0;
          if (iVar2 - armor_min != 0 && armor_min <= iVar2) {
            fVar8 = (float)((iVar2 - armor_min) / 2);
          }
        }
        else {
          fVar8 = (float)(iVar2 - armor);
        }
        iVar2 = (int)((double)(iVar1 + 0x37) * 0.8);
        if (0xb4 < iVar2) {
          dVar7 = (double)(iVar2 + -0xb4);
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          dVar7 = floor(dVar7);
          iVar2 = (int)(dVar7 + 180.0);
        }
        iVar2 = (int)(float)iVar2;
        if (iVar2 < armor_max) {
          fVar5 = 0.0;
          if (iVar2 - armor_min != 0 && armor_min <= iVar2) {
            fVar5 = (float)((iVar2 - armor_min) / 2);
          }
        }
        else {
          fVar5 = (float)(iVar2 - armor);
        }
        dVar9 = (double)accu_coef;
        dVar7 = (double)(int)lVar3;
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        fVar6 = (float)((double)fVar6 +
                       (dVar9 * dVar7 + 1.0) * ((double)fVar8 * 0.6 + (double)fVar5 * 0.4));
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar3 < carrierNum);
  }
  return fVar6;
}

Assistant:

inline float formularAllShipAtk(int shipAtk[]){
    float res=0;
    for(int i=0;i<carrierNum;i++){
        if(shipAtk[i] == 0) continue;//��վ
        int rawDamage = formula_shipAtk_rawDamage(shipAtk[i], theCarrier[i].atk);
        res += (armorSimu(formula_shipAtk_cocurHeading(rawDamage))*0.6 + armorSimu(formula_shipAtk_invertHeading(rawDamage))*0.4) * (1+accu_coef*sqrt(i));
    }
    return res;
}